

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

void test_scalar_constructors(void)

{
  ostream *poVar1;
  undefined1 local_228 [8];
  json s;
  json d;
  json i;
  json f;
  json t;
  undefined1 local_60 [8];
  json null;
  
  std::operator<<((ostream *)jlog,"test_scalar_constructors()\n");
  argo::json::json((json *)local_60);
  poVar1 = argo::operator<<((ostream *)jlog,(json *)local_60);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  argo::json::json((json *)&f.field_0x50,true);
  poVar1 = argo::operator<<((ostream *)jlog,(json *)&f.field_0x50);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  argo::json::json((json *)&i.field_0x50,false);
  poVar1 = argo::operator<<((ostream *)jlog,(json *)&i.field_0x50);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  argo::json::json((json *)&d.field_0x50,0x7b);
  poVar1 = argo::operator<<((ostream *)jlog,(json *)&d.field_0x50);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  argo::json::json((json *)&s.field_0x50,123.4);
  poVar1 = argo::operator<<((ostream *)jlog,(json *)&s.field_0x50);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  argo::json::json((json *)local_228,"asdasd");
  poVar1 = argo::operator<<((ostream *)jlog,(json *)local_228);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  argo::json::~json((json *)local_228);
  argo::json::~json((json *)&s.field_0x50);
  argo::json::~json((json *)&d.field_0x50);
  argo::json::~json((json *)&i.field_0x50);
  argo::json::~json((json *)&f.field_0x50);
  argo::json::~json((json *)local_60);
  return;
}

Assistant:

void test_scalar_constructors()
{
    jlog << "test_scalar_constructors()\n";
    json null;
    jlog << null << endl;
    json t(true);
    jlog << t << endl;
    json f(false);
    jlog << f << endl;
    json i(123);
    jlog << i << endl;
    json d(123.4);
    jlog << d << endl;
    json s("asdasd");
    jlog << s << endl;
}